

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

gzFile mcpl_gzopen(char *filename,char *mode)

{
  mcu8str *str;
  undefined8 in_RSI;
  long in_RDI;
  gzFile res;
  char *use_fn;
  mcu8str rp;
  mcu8str f;
  mcu8str *in_stack_00001000;
  long local_58;
  char *in_stack_ffffffffffffffb0;
  long local_40;
  int local_38;
  
  mcu8str_view_cstr(in_stack_ffffffffffffffb0);
  mctools_real_path(in_stack_00001000);
  local_58 = in_RDI;
  if ((local_40 != 0) && (local_38 != 0)) {
    local_58 = local_40;
  }
  str = (mcu8str *)gzopen64(local_58,in_RSI);
  mcu8str_dealloc(str);
  return (gzFile)str;
}

Assistant:

MCPL_LOCAL gzFile mcpl_gzopen( const char * filename, const char * mode )
{
  mcu8str f = mcu8str_view_cstr( filename );
#ifdef _WIN32
  wchar_t* wpath = mctools_path2wpath(&f);//must free(..) return value.
  gzFile res = gzopen_w(wpath,mode);
  free(wpath);
#else
  mcu8str rp = mctools_real_path( &f );
  const char * use_fn = ( rp.c_str && rp.size > 0 ) ? rp.c_str : filename ;
#  ifdef Z_LARGE64
  gzFile res = gzopen64( use_fn, mode );
#  else
  gzFile res = gzopen( use_fn, mode );
#  endif
  mcu8str_dealloc( &rp );
#endif
  return res;
}